

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.h
# Opt level: O3

void __thiscall r_exec::ObjectValue::~ObjectValue(ObjectValue *this)

{
  _Object *p_Var1;
  
  (this->super_BoundValue).super_Value.super__Object._vptr__Object =
       (_func_int **)&PTR__ObjectValue_001be0e0;
  p_Var1 = (this->object).object;
  if (p_Var1 != (_Object *)0x0) {
    LOCK();
    (p_Var1->refCount).super___atomic_base<long>._M_i =
         (p_Var1->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if ((p_Var1->refCount).super___atomic_base<long>._M_i < 1) {
      (*p_Var1->_vptr__Object[1])();
    }
  }
  operator_delete(this);
  return;
}

Assistant:

class REPLICODE_EXPORT ObjectValue:
    public BoundValue
{
private:
    const core::P<r_code::Code> object;
public:
    ObjectValue(BindingMap *map, r_code::Code *object);

    Value *copy(BindingMap *map) const;
    void valuate(r_code::Code *destination, uint16_t write_index, uint16_t &extent_index) const;
    bool match(const r_code::Code *object, uint16_t index);
    r_code::Atom *get_code();
    r_code::Code *get_object();
    uint16_t get_code_size();

    bool intersect(const Value *v) const;
    bool _intersect(const ObjectValue *v) const;

    bool contains(const r_code::Code *o) const;
}